

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum-dtoa.cc
# Opt level: O1

void TestBignumDtoaGayPrecision(void)

{
  BignumDtoaMode mode;
  uint uVar1;
  char *__s1;
  int iVar2;
  PrecomputedPrecision *pPVar3;
  ulong uVar4;
  long lVar5;
  Vector<const_double_conversion::PrecomputedPrecision> VVar6;
  Vector<char> buffer;
  Vector<char> representation;
  int point;
  int length;
  char buffer_container [100];
  int *in_stack_ffffffffffffff48;
  uint local_a8;
  int local_a4;
  long local_a0;
  char local_98 [104];
  
  VVar6 = double_conversion::PrecomputedPrecisionRepresentations();
  pPVar3 = VVar6.start_;
  if (0 < VVar6.length_) {
    local_a0 = (VVar6._8_8_ & 0xffffffff) << 5;
    lVar5 = 0;
    do {
      mode = *(BignumDtoaMode *)((long)&pPVar3->number_digits + lVar5);
      __s1 = *(char **)((long)&pPVar3->representation + lVar5);
      uVar1 = *(uint *)((long)&pPVar3->decimal_point + lVar5);
      uVar4 = (ulong)mode;
      buffer._8_8_ = &local_a4;
      buffer.start_ = (char *)0x64;
      double_conversion::BignumDtoa
                ((double_conversion *)0x3,*(double *)((long)&pPVar3->v + lVar5),mode,(int)local_98,
                 buffer,(int *)&local_a8,in_stack_ffffffffffffff48);
      if (uVar1 != local_a8) {
        printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
               "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-bignum-dtoa.cc"
               ,0x18b,"current_test.decimal_point","point",(ulong)uVar1,
               CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),local_a8));
        abort();
      }
      if ((int)mode < local_a4) {
        printf("%s:%d:\n CHECK(%s) failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-bignum-dtoa.cc"
               ,0x18c,"(number_digits) >= (length)");
LAB_0082a5f4:
        abort();
      }
      representation._8_8_ = uVar4;
      representation.start_ = local_98;
      TrimRepresentation(representation);
      if (__s1 == (char *)0x0) goto LAB_0082a5f4;
      iVar2 = strcmp(__s1,local_98);
      if (iVar2 != 0) {
        printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-bignum-dtoa.cc"
               ,0x18e,"current_test.representation","buffer.start()",__s1,local_98);
        abort();
      }
      lVar5 = lVar5 + 0x20;
    } while (local_a0 != lVar5);
  }
  return;
}

Assistant:

TEST(BignumDtoaGayPrecision) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;

  Vector<const PrecomputedPrecision> precomputed =
      PrecomputedPrecisionRepresentations();
  for (int i = 0; i < precomputed.length(); ++i) {
    const PrecomputedPrecision current_test = precomputed[i];
    double v = current_test.v;
    int number_digits = current_test.number_digits;
    BignumDtoa(v, BIGNUM_DTOA_PRECISION, number_digits,
               buffer, &length, &point);
    CHECK_EQ(current_test.decimal_point, point);
    CHECK_GE(number_digits, length);
    TrimRepresentation(buffer);
    CHECK_EQ(current_test.representation, buffer.start());
  }
}